

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Mat *pMVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  int _d;
  int _c;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  long lVar45;
  float *pfVar46;
  long lVar47;
  float *pfVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  Mat *pMVar52;
  Mat *pMVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  void *pvVar60;
  float fVar61;
  float *outptr;
  Mat local_1a8;
  Option *local_160;
  Mat local_158;
  Mat local_108;
  int local_b4;
  float *local_b0;
  BinaryOp *local_a8;
  ulong local_a0;
  long local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  void *local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar50 = pMVar5[1].dims;
  if (pMVar5[1].dims < pMVar5->dims) {
    iVar50 = pMVar5->dims;
  }
  local_108.data = pMVar5->data;
  piVar6 = pMVar5->refcount;
  local_108.refcount._0_4_ = SUB84(piVar6,0);
  local_108.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  local_108.elemsize._0_4_ = (undefined4)pMVar5->elemsize;
  local_108.elemsize._4_4_ = (undefined4)(pMVar5->elemsize >> 0x20);
  local_108.elempack = pMVar5->elempack;
  local_108.allocator = pMVar5->allocator;
  local_108.dims = pMVar5->dims;
  local_108.w = pMVar5->w;
  local_108.h = pMVar5->h;
  local_108.d = pMVar5->d;
  local_108.c = pMVar5->c;
  local_108.cstep = pMVar5->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  local_158.data = pMVar5[1].data;
  piVar6 = pMVar5[1].refcount;
  local_158.refcount._0_4_ = SUB84(piVar6,0);
  local_158.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  local_158.elemsize._0_4_ = (undefined4)pMVar5[1].elemsize;
  local_158.elemsize._4_4_ = (undefined4)(pMVar5[1].elemsize >> 0x20);
  local_158.elempack = pMVar5[1].elempack;
  local_158.allocator = pMVar5[1].allocator;
  local_158.dims = pMVar5[1].dims;
  local_158.w = pMVar5[1].w;
  local_158.h = pMVar5[1].h;
  local_158.d = pMVar5[1].d;
  local_158.c = pMVar5[1].c;
  local_158.cstep = pMVar5[1].cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  local_160 = opt;
  if (pMVar5->dims < iVar50) {
    if (iVar50 == 2) {
      if (pMVar5->w == pMVar5[1].h) {
        Mat::reshape(&local_1a8,pMVar5,1,pMVar5->w,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              if ((float *)local_108.data != (float *)0x0) {
                free(local_108.data);
              }
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_108.data = local_1a8.data;
        local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_108.elempack = local_1a8.elempack;
        local_108.allocator = local_1a8.allocator;
        uVar9._0_4_ = local_1a8.dims;
        uVar9._4_4_ = local_1a8.w;
        local_108.dims = local_1a8.dims;
        local_108.w = local_1a8.w;
        uVar10._0_4_ = local_1a8.h;
        uVar10._4_4_ = local_1a8.d;
        local_108.h = local_1a8.h;
        local_108.d = local_1a8.d;
        local_108.c = local_1a8.c;
        local_108.cstep = local_1a8.cstep;
        uVar43 = uVar9;
        uVar44 = uVar10;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          uVar43 = local_108._40_8_;
          uVar44 = local_108._48_8_;
          if (*piVar6 == 0) {
            local_108._40_8_ = uVar9;
            local_108._48_8_ = uVar10;
            if (local_1a8.allocator == (Allocator *)0x0) {
LAB_003c2258:
              local_108.data = local_1a8.data;
              local_108.allocator = local_1a8.allocator;
              uVar43 = local_108._40_8_;
              uVar44 = local_108._48_8_;
              if ((float *)local_1a8.data != (float *)0x0) {
                free(local_1a8.data);
                uVar43 = local_108._40_8_;
                uVar44 = local_108._48_8_;
              }
            }
            else {
              (*(local_1a8.allocator)->_vptr_Allocator[3])();
              uVar43 = local_108._40_8_;
              uVar44 = local_108._48_8_;
            }
          }
        }
      }
      else {
        Mat::reshape(&local_1a8,pMVar5,pMVar5->w,1,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              if ((float *)local_108.data != (float *)0x0) {
                free(local_108.data);
              }
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_108.data = local_1a8.data;
        local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_108.elempack = local_1a8.elempack;
        local_108.allocator = local_1a8.allocator;
        uVar41._0_4_ = local_1a8.dims;
        uVar41._4_4_ = local_1a8.w;
        local_108.dims = local_1a8.dims;
        local_108.w = local_1a8.w;
        uVar42._0_4_ = local_1a8.h;
        uVar42._4_4_ = local_1a8.d;
        local_108.h = local_1a8.h;
        local_108.d = local_1a8.d;
        local_108.c = local_1a8.c;
        local_108.cstep = local_1a8.cstep;
        uVar43 = local_108._40_8_;
        uVar44 = local_108._48_8_;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) goto LAB_003c2258;
            local_108._40_8_ = uVar41;
            local_108._48_8_ = uVar42;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar43 = local_108._40_8_;
            uVar44 = local_108._48_8_;
          }
        }
      }
      local_108._48_8_ = uVar44;
      local_108._40_8_ = uVar43;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 3) && (pMVar5->dims == 1)) {
      if (pMVar5->w == pMVar5[1].c) {
        Mat::reshape(&local_1a8,pMVar5,1,1,pMVar5->w,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              if ((float *)local_108.data != (float *)0x0) {
                free(local_108.data);
              }
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_108.data = local_1a8.data;
        local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_108.elempack = local_1a8.elempack;
        local_108.allocator = local_1a8.allocator;
        uVar11._0_4_ = local_1a8.dims;
        uVar11._4_4_ = local_1a8.w;
        local_108.dims = local_1a8.dims;
        local_108.w = local_1a8.w;
        uVar12._0_4_ = local_1a8.h;
        uVar12._4_4_ = local_1a8.d;
        local_108.h = local_1a8.h;
        local_108.d = local_1a8.d;
        local_108.c = local_1a8.c;
        local_108.cstep = local_1a8.cstep;
        uVar41 = uVar11;
        uVar42 = uVar12;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          uVar41 = local_108._40_8_;
          uVar42 = local_108._48_8_;
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) {
LAB_003c2505:
              local_108.data = local_1a8.data;
              local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
              local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
              local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
              local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
              local_108.elempack = local_1a8.elempack;
              local_108.allocator = local_1a8.allocator;
              uVar41 = local_1a8._40_8_;
              uVar42 = local_1a8._48_8_;
              local_108.c = local_1a8.c;
              local_108.cstep = local_1a8.cstep;
              if ((float *)local_1a8.data != (float *)0x0) {
                local_108._40_8_ = local_1a8._40_8_;
                local_108._48_8_ = local_1a8._48_8_;
                free(local_1a8.data);
                uVar41 = local_108._40_8_;
                uVar42 = local_108._48_8_;
              }
            }
            else {
              local_108._40_8_ = uVar11;
              local_108._48_8_ = uVar12;
              (*(local_1a8.allocator)->_vptr_Allocator[3])();
              uVar41 = local_108._40_8_;
              uVar42 = local_108._48_8_;
            }
          }
        }
      }
      else {
        Mat::reshape(&local_1a8,pMVar5,pMVar5->w,1,1,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              if ((float *)local_108.data != (float *)0x0) {
                free(local_108.data);
              }
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_108.data = local_1a8.data;
        local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_108.elempack = local_1a8.elempack;
        local_108.allocator = local_1a8.allocator;
        uVar43._0_4_ = local_1a8.dims;
        uVar43._4_4_ = local_1a8.w;
        local_108.dims = local_1a8.dims;
        local_108.w = local_1a8.w;
        uVar44._0_4_ = local_1a8.h;
        uVar44._4_4_ = local_1a8.d;
        local_108.h = local_1a8.h;
        local_108.d = local_1a8.d;
        local_108.c = local_1a8.c;
        local_108.cstep = local_1a8.cstep;
        uVar41 = local_108._40_8_;
        uVar42 = local_108._48_8_;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) goto LAB_003c2505;
            local_108._40_8_ = uVar43;
            local_108._48_8_ = uVar44;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_108._40_8_;
            uVar42 = local_108._48_8_;
          }
        }
      }
      local_108._48_8_ = uVar42;
      local_108._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 3) && (pMVar5->dims == 2)) {
      Mat::reshape(&local_1a8,pMVar5,1,pMVar5->w,pMVar5->h,(Allocator *)0x0);
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            if ((float *)local_108.data != (float *)0x0) {
              free(local_108.data);
            }
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      local_108.data = local_1a8.data;
      local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
      local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
      local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
      local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
      local_108.elempack = local_1a8.elempack;
      local_108.allocator = local_1a8.allocator;
      uVar13._0_4_ = local_1a8.dims;
      uVar13._4_4_ = local_1a8.w;
      local_108.dims = local_1a8.dims;
      local_108.w = local_1a8.w;
      uVar14._0_4_ = local_1a8.h;
      uVar14._4_4_ = local_1a8.d;
      local_108.h = local_1a8.h;
      local_108.d = local_1a8.d;
      local_108.c = local_1a8.c;
      local_108.cstep = local_1a8.cstep;
      uVar41 = uVar13;
      uVar42 = uVar14;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        uVar41 = local_108._40_8_;
        uVar42 = local_108._48_8_;
        if (*piVar6 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            if ((float *)local_1a8.data != (float *)0x0) {
              local_108._40_8_ = uVar13;
              local_108._48_8_ = uVar14;
              free(local_1a8.data);
              uVar41 = local_108._40_8_;
              uVar42 = local_108._48_8_;
            }
          }
          else {
            local_108._40_8_ = uVar13;
            local_108._48_8_ = uVar14;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_108._40_8_;
            uVar42 = local_108._48_8_;
          }
        }
      }
      local_108._48_8_ = uVar42;
      local_108._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 4) && (pMVar5->dims == 1)) {
      if (pMVar5->w == pMVar5[1].c) {
        Mat::reshape(&local_1a8,pMVar5,1,1,1,pMVar5->w,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              if ((float *)local_108.data != (float *)0x0) {
                free(local_108.data);
              }
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_108.data = local_1a8.data;
        local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_108.elempack = local_1a8.elempack;
        local_108.allocator = local_1a8.allocator;
        uVar15._0_4_ = local_1a8.dims;
        uVar15._4_4_ = local_1a8.w;
        local_108.dims = local_1a8.dims;
        local_108.w = local_1a8.w;
        uVar16._0_4_ = local_1a8.h;
        uVar16._4_4_ = local_1a8.d;
        local_108.h = local_1a8.h;
        local_108.d = local_1a8.d;
        local_108.c = local_1a8.c;
        local_108.cstep = local_1a8.cstep;
        uVar41 = uVar15;
        uVar42 = uVar16;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          uVar41 = local_108._40_8_;
          uVar42 = local_108._48_8_;
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) {
LAB_003c292d:
              local_108.data = local_1a8.data;
              local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
              local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
              local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
              local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
              local_108.elempack = local_1a8.elempack;
              local_108.allocator = local_1a8.allocator;
              uVar41 = local_1a8._40_8_;
              uVar42 = local_1a8._48_8_;
              local_108.c = local_1a8.c;
              local_108.cstep = local_1a8.cstep;
              if ((float *)local_1a8.data != (float *)0x0) {
                local_108._40_8_ = local_1a8._40_8_;
                local_108._48_8_ = local_1a8._48_8_;
                free(local_1a8.data);
                uVar41 = local_108._40_8_;
                uVar42 = local_108._48_8_;
              }
            }
            else {
              local_108._40_8_ = uVar15;
              local_108._48_8_ = uVar16;
              (*(local_1a8.allocator)->_vptr_Allocator[3])();
              uVar41 = local_108._40_8_;
              uVar42 = local_108._48_8_;
            }
          }
        }
      }
      else {
        Mat::reshape(&local_1a8,pMVar5,pMVar5->w,1,1,1,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              if ((float *)local_108.data != (float *)0x0) {
                free(local_108.data);
              }
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_108.data = local_1a8.data;
        local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_108.elempack = local_1a8.elempack;
        local_108.allocator = local_1a8.allocator;
        uVar17._0_4_ = local_1a8.dims;
        uVar17._4_4_ = local_1a8.w;
        local_108.dims = local_1a8.dims;
        local_108.w = local_1a8.w;
        uVar18._0_4_ = local_1a8.h;
        uVar18._4_4_ = local_1a8.d;
        local_108.h = local_1a8.h;
        local_108.d = local_1a8.d;
        local_108.c = local_1a8.c;
        local_108.cstep = local_1a8.cstep;
        uVar41 = local_108._40_8_;
        uVar42 = local_108._48_8_;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) goto LAB_003c292d;
            local_108._40_8_ = uVar17;
            local_108._48_8_ = uVar18;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_108._40_8_;
            uVar42 = local_108._48_8_;
          }
        }
      }
      local_108._48_8_ = uVar42;
      local_108._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 4) && (pMVar5->dims == 2)) {
      Mat::reshape(&local_1a8,pMVar5,1,1,pMVar5->w,pMVar5->h,(Allocator *)0x0);
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            if ((float *)local_108.data != (float *)0x0) {
              free(local_108.data);
            }
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      local_108.data = local_1a8.data;
      local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
      local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
      local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
      local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
      local_108.elempack = local_1a8.elempack;
      local_108.allocator = local_1a8.allocator;
      uVar19._0_4_ = local_1a8.dims;
      uVar19._4_4_ = local_1a8.w;
      local_108.dims = local_1a8.dims;
      local_108.w = local_1a8.w;
      uVar20._0_4_ = local_1a8.h;
      uVar20._4_4_ = local_1a8.d;
      local_108.h = local_1a8.h;
      local_108.d = local_1a8.d;
      local_108.c = local_1a8.c;
      local_108.cstep = local_1a8.cstep;
      uVar41 = uVar19;
      uVar42 = uVar20;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        uVar41 = local_108._40_8_;
        uVar42 = local_108._48_8_;
        if (*piVar6 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            if ((float *)local_1a8.data != (float *)0x0) {
              local_108._40_8_ = uVar19;
              local_108._48_8_ = uVar20;
              free(local_1a8.data);
              uVar41 = local_108._40_8_;
              uVar42 = local_108._48_8_;
            }
          }
          else {
            local_108._40_8_ = uVar19;
            local_108._48_8_ = uVar20;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_108._40_8_;
            uVar42 = local_108._48_8_;
          }
        }
      }
      local_108._48_8_ = uVar42;
      local_108._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 4) && (pMVar5->dims == 3)) {
      Mat::reshape(&local_1a8,pMVar5,1,pMVar5->w,pMVar5->h,pMVar5->c,(Allocator *)0x0);
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            if ((float *)local_108.data != (float *)0x0) {
              free(local_108.data);
            }
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      local_108.data = local_1a8.data;
      local_108.refcount._0_4_ = local_1a8.refcount._0_4_;
      local_108.refcount._4_4_ = local_1a8.refcount._4_4_;
      local_108.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
      local_108.elemsize._4_4_ = local_1a8.elemsize._4_4_;
      local_108.elempack = local_1a8.elempack;
      local_108.allocator = local_1a8.allocator;
      uVar21._0_4_ = local_1a8.dims;
      uVar21._4_4_ = local_1a8.w;
      local_108.dims = local_1a8.dims;
      local_108.w = local_1a8.w;
      uVar22._0_4_ = local_1a8.h;
      uVar22._4_4_ = local_1a8.d;
      local_108.h = local_1a8.h;
      local_108.d = local_1a8.d;
      local_108.c = local_1a8.c;
      local_108.cstep = local_1a8.cstep;
      uVar41 = uVar21;
      uVar42 = uVar22;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        uVar41 = local_108._40_8_;
        uVar42 = local_108._48_8_;
        if (*piVar6 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            if ((float *)local_1a8.data != (float *)0x0) {
              local_108._40_8_ = uVar21;
              local_108._48_8_ = uVar22;
              free(local_1a8.data);
              uVar41 = local_108._40_8_;
              uVar42 = local_108._48_8_;
            }
          }
          else {
            local_108._40_8_ = uVar21;
            local_108._48_8_ = uVar22;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_108._40_8_;
            uVar42 = local_108._48_8_;
          }
        }
      }
      local_108._48_8_ = uVar42;
      local_108._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
  }
  local_a8 = this;
  if (pMVar5[1].dims < iVar50) {
    pMVar53 = pMVar5 + 1;
    if (iVar50 == 2) {
      iVar49 = pMVar5[1].w;
      if (iVar49 == pMVar5->h) {
        Mat::reshape(&local_1a8,pMVar53,1,iVar49,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if ((float *)local_158.data != (float *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_158.data = local_1a8.data;
        local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_158.elempack = local_1a8.elempack;
        local_158.allocator = local_1a8.allocator;
        uVar23._0_4_ = local_1a8.dims;
        uVar23._4_4_ = local_1a8.w;
        local_158.dims = local_1a8.dims;
        local_158.w = local_1a8.w;
        uVar24._0_4_ = local_1a8.h;
        uVar24._4_4_ = local_1a8.d;
        local_158.h = local_1a8.h;
        local_158.d = local_1a8.d;
        local_158.c = local_1a8.c;
        local_158.cstep = local_1a8.cstep;
        uVar41 = uVar23;
        uVar42 = uVar24;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          uVar41 = local_158._40_8_;
          uVar42 = local_158._48_8_;
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) {
LAB_003c2e72:
              local_158.data = local_1a8.data;
              local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
              local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
              local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
              local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
              local_158.elempack = local_1a8.elempack;
              local_158.allocator = local_1a8.allocator;
              uVar41 = local_1a8._40_8_;
              uVar42 = local_1a8._48_8_;
              local_158.c = local_1a8.c;
              local_158.cstep = local_1a8.cstep;
              if ((float *)local_1a8.data != (float *)0x0) {
                local_158._40_8_ = local_1a8._40_8_;
                local_158._48_8_ = local_1a8._48_8_;
                free(local_1a8.data);
                uVar41 = local_158._40_8_;
                uVar42 = local_158._48_8_;
              }
            }
            else {
              local_158._40_8_ = uVar23;
              local_158._48_8_ = uVar24;
              (*(local_1a8.allocator)->_vptr_Allocator[3])();
              uVar41 = local_158._40_8_;
              uVar42 = local_158._48_8_;
            }
          }
        }
      }
      else {
        Mat::reshape(&local_1a8,pMVar53,iVar49,1,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if ((float *)local_158.data != (float *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_158.data = local_1a8.data;
        local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_158.elempack = local_1a8.elempack;
        local_158.allocator = local_1a8.allocator;
        uVar25._0_4_ = local_1a8.dims;
        uVar25._4_4_ = local_1a8.w;
        local_158.dims = local_1a8.dims;
        local_158.w = local_1a8.w;
        uVar26._0_4_ = local_1a8.h;
        uVar26._4_4_ = local_1a8.d;
        local_158.h = local_1a8.h;
        local_158.d = local_1a8.d;
        local_158.c = local_1a8.c;
        local_158.cstep = local_1a8.cstep;
        uVar41 = local_158._40_8_;
        uVar42 = local_158._48_8_;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) goto LAB_003c2e72;
            local_158._40_8_ = uVar25;
            local_158._48_8_ = uVar26;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_158._40_8_;
            uVar42 = local_158._48_8_;
          }
        }
      }
      local_158._48_8_ = uVar42;
      local_158._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 3) && (pMVar5[1].dims == 1)) {
      iVar49 = pMVar5[1].w;
      if (iVar49 == pMVar5->c) {
        Mat::reshape(&local_1a8,pMVar53,1,1,iVar49,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if ((float *)local_158.data != (float *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_158.data = local_1a8.data;
        local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_158.elempack = local_1a8.elempack;
        local_158.allocator = local_1a8.allocator;
        uVar27._0_4_ = local_1a8.dims;
        uVar27._4_4_ = local_1a8.w;
        local_158.dims = local_1a8.dims;
        local_158.w = local_1a8.w;
        uVar28._0_4_ = local_1a8.h;
        uVar28._4_4_ = local_1a8.d;
        local_158.h = local_1a8.h;
        local_158.d = local_1a8.d;
        local_158.c = local_1a8.c;
        local_158.cstep = local_1a8.cstep;
        uVar41 = uVar27;
        uVar42 = uVar28;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          uVar41 = local_158._40_8_;
          uVar42 = local_158._48_8_;
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) {
LAB_003c30e7:
              local_158.data = local_1a8.data;
              local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
              local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
              local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
              local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
              local_158.elempack = local_1a8.elempack;
              local_158.allocator = local_1a8.allocator;
              uVar41 = local_1a8._40_8_;
              uVar42 = local_1a8._48_8_;
              local_158.c = local_1a8.c;
              local_158.cstep = local_1a8.cstep;
              if ((float *)local_1a8.data != (float *)0x0) {
                local_158._40_8_ = local_1a8._40_8_;
                local_158._48_8_ = local_1a8._48_8_;
                free(local_1a8.data);
                uVar41 = local_158._40_8_;
                uVar42 = local_158._48_8_;
              }
            }
            else {
              local_158._40_8_ = uVar27;
              local_158._48_8_ = uVar28;
              (*(local_1a8.allocator)->_vptr_Allocator[3])();
              uVar41 = local_158._40_8_;
              uVar42 = local_158._48_8_;
            }
          }
        }
      }
      else {
        Mat::reshape(&local_1a8,pMVar53,iVar49,1,1,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if ((float *)local_158.data != (float *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_158.data = local_1a8.data;
        local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_158.elempack = local_1a8.elempack;
        local_158.allocator = local_1a8.allocator;
        uVar29._0_4_ = local_1a8.dims;
        uVar29._4_4_ = local_1a8.w;
        local_158.dims = local_1a8.dims;
        local_158.w = local_1a8.w;
        uVar30._0_4_ = local_1a8.h;
        uVar30._4_4_ = local_1a8.d;
        local_158.h = local_1a8.h;
        local_158.d = local_1a8.d;
        local_158.c = local_1a8.c;
        local_158.cstep = local_1a8.cstep;
        uVar41 = local_158._40_8_;
        uVar42 = local_158._48_8_;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) goto LAB_003c30e7;
            local_158._40_8_ = uVar29;
            local_158._48_8_ = uVar30;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_158._40_8_;
            uVar42 = local_158._48_8_;
          }
        }
      }
      local_158._48_8_ = uVar42;
      local_158._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 3) && (pMVar5[1].dims == 2)) {
      Mat::reshape(&local_1a8,pMVar53,1,pMVar5[1].w,pMVar5[1].h,(Allocator *)0x0);
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((float *)local_158.data != (float *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      local_158.data = local_1a8.data;
      local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
      local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
      local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
      local_158.elempack = local_1a8.elempack;
      local_158.allocator = local_1a8.allocator;
      uVar31._0_4_ = local_1a8.dims;
      uVar31._4_4_ = local_1a8.w;
      local_158.dims = local_1a8.dims;
      local_158.w = local_1a8.w;
      uVar32._0_4_ = local_1a8.h;
      uVar32._4_4_ = local_1a8.d;
      local_158.h = local_1a8.h;
      local_158.d = local_1a8.d;
      local_158.c = local_1a8.c;
      local_158.cstep = local_1a8.cstep;
      uVar41 = uVar31;
      uVar42 = uVar32;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        uVar41 = local_158._40_8_;
        uVar42 = local_158._48_8_;
        if (*piVar6 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            if ((float *)local_1a8.data != (float *)0x0) {
              local_158._40_8_ = uVar31;
              local_158._48_8_ = uVar32;
              free(local_1a8.data);
              uVar41 = local_158._40_8_;
              uVar42 = local_158._48_8_;
            }
          }
          else {
            local_158._40_8_ = uVar31;
            local_158._48_8_ = uVar32;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_158._40_8_;
            uVar42 = local_158._48_8_;
          }
        }
      }
      local_158._48_8_ = uVar42;
      local_158._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 4) && (pMVar5[1].dims == 1)) {
      iVar49 = pMVar5[1].w;
      if (iVar49 == pMVar5->c) {
        Mat::reshape(&local_1a8,pMVar53,1,1,1,iVar49,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if ((float *)local_158.data != (float *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_158.data = local_1a8.data;
        local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_158.elempack = local_1a8.elempack;
        local_158.allocator = local_1a8.allocator;
        uVar33._0_4_ = local_1a8.dims;
        uVar33._4_4_ = local_1a8.w;
        local_158.dims = local_1a8.dims;
        local_158.w = local_1a8.w;
        uVar34._0_4_ = local_1a8.h;
        uVar34._4_4_ = local_1a8.d;
        local_158.h = local_1a8.h;
        local_158.d = local_1a8.d;
        local_158.c = local_1a8.c;
        local_158.cstep = local_1a8.cstep;
        uVar41 = uVar33;
        uVar42 = uVar34;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          uVar41 = local_158._40_8_;
          uVar42 = local_158._48_8_;
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) {
LAB_003c34b9:
              local_158.data = local_1a8.data;
              local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
              local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
              local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
              local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
              local_158.elempack = local_1a8.elempack;
              local_158.allocator = local_1a8.allocator;
              uVar41 = local_1a8._40_8_;
              uVar42 = local_1a8._48_8_;
              local_158.c = local_1a8.c;
              local_158.cstep = local_1a8.cstep;
              if ((float *)local_1a8.data != (float *)0x0) {
                local_158._40_8_ = local_1a8._40_8_;
                local_158._48_8_ = local_1a8._48_8_;
                free(local_1a8.data);
                uVar41 = local_158._40_8_;
                uVar42 = local_158._48_8_;
              }
            }
            else {
              local_158._40_8_ = uVar33;
              local_158._48_8_ = uVar34;
              (*(local_1a8.allocator)->_vptr_Allocator[3])();
              uVar41 = local_158._40_8_;
              uVar42 = local_158._48_8_;
            }
          }
        }
      }
      else {
        Mat::reshape(&local_1a8,pMVar53,iVar49,1,1,1,(Allocator *)0x0);
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if ((float *)local_158.data != (float *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
        local_158.data = local_1a8.data;
        local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
        local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
        local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
        local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
        local_158.elempack = local_1a8.elempack;
        local_158.allocator = local_1a8.allocator;
        uVar35._0_4_ = local_1a8.dims;
        uVar35._4_4_ = local_1a8.w;
        local_158.dims = local_1a8.dims;
        local_158.w = local_1a8.w;
        uVar36._0_4_ = local_1a8.h;
        uVar36._4_4_ = local_1a8.d;
        local_158.h = local_1a8.h;
        local_158.d = local_1a8.d;
        local_158.c = local_1a8.c;
        local_158.cstep = local_1a8.cstep;
        uVar41 = local_158._40_8_;
        uVar42 = local_158._48_8_;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1a8.allocator == (Allocator *)0x0) goto LAB_003c34b9;
            local_158._40_8_ = uVar35;
            local_158._48_8_ = uVar36;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_158._40_8_;
            uVar42 = local_158._48_8_;
          }
        }
      }
      local_158._48_8_ = uVar42;
      local_158._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 4) && (pMVar5[1].dims == 2)) {
      Mat::reshape(&local_1a8,pMVar53,1,1,pMVar5[1].w,pMVar5[1].h,(Allocator *)0x0);
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((float *)local_158.data != (float *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      local_158.data = local_1a8.data;
      local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
      local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
      local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
      local_158.elempack = local_1a8.elempack;
      local_158.allocator = local_1a8.allocator;
      uVar37._0_4_ = local_1a8.dims;
      uVar37._4_4_ = local_1a8.w;
      local_158.dims = local_1a8.dims;
      local_158.w = local_1a8.w;
      uVar38._0_4_ = local_1a8.h;
      uVar38._4_4_ = local_1a8.d;
      local_158.h = local_1a8.h;
      local_158.d = local_1a8.d;
      local_158.c = local_1a8.c;
      local_158.cstep = local_1a8.cstep;
      uVar41 = uVar37;
      uVar42 = uVar38;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        uVar41 = local_158._40_8_;
        uVar42 = local_158._48_8_;
        if (*piVar6 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            if ((float *)local_1a8.data != (float *)0x0) {
              local_158._40_8_ = uVar37;
              local_158._48_8_ = uVar38;
              free(local_1a8.data);
              uVar41 = local_158._40_8_;
              uVar42 = local_158._48_8_;
            }
          }
          else {
            local_158._40_8_ = uVar37;
            local_158._48_8_ = uVar38;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_158._40_8_;
            uVar42 = local_158._48_8_;
          }
        }
      }
      local_158._48_8_ = uVar42;
      local_158._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
    if ((iVar50 == 4) && (pMVar5[1].dims == 3)) {
      Mat::reshape(&local_1a8,pMVar53,1,pMVar5[1].w,pMVar5[1].h,pMVar5[1].c,(Allocator *)0x0);
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((float *)local_158.data != (float *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      local_158.data = local_1a8.data;
      local_158.refcount._0_4_ = local_1a8.refcount._0_4_;
      local_158.refcount._4_4_ = local_1a8.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
      local_158.elemsize._4_4_ = local_1a8.elemsize._4_4_;
      local_158.elempack = local_1a8.elempack;
      local_158.allocator = local_1a8.allocator;
      uVar39._0_4_ = local_1a8.dims;
      uVar39._4_4_ = local_1a8.w;
      local_158.dims = local_1a8.dims;
      local_158.w = local_1a8.w;
      uVar40._0_4_ = local_1a8.h;
      uVar40._4_4_ = local_1a8.d;
      local_158.h = local_1a8.h;
      local_158.d = local_1a8.d;
      local_158.c = local_1a8.c;
      local_158.cstep = local_1a8.cstep;
      uVar41 = uVar39;
      uVar42 = uVar40;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        uVar41 = local_158._40_8_;
        uVar42 = local_158._48_8_;
        if (*piVar6 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            if ((float *)local_1a8.data != (float *)0x0) {
              local_158._40_8_ = uVar39;
              local_158._48_8_ = uVar40;
              free(local_1a8.data);
              uVar41 = local_158._40_8_;
              uVar42 = local_158._48_8_;
            }
          }
          else {
            local_158._40_8_ = uVar39;
            local_158._48_8_ = uVar40;
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            uVar41 = local_158._40_8_;
            uVar42 = local_158._48_8_;
          }
        }
      }
      local_158._48_8_ = uVar42;
      local_158._40_8_ = uVar41;
      local_1a8.cstep = 0;
      local_1a8.data = (float *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
    }
  }
  iVar49 = local_158.w;
  if (local_158.w < local_108.w) {
    iVar49 = local_108.w;
  }
  iVar1 = local_158.h;
  if (local_158.h < local_108.h) {
    iVar1 = local_108.h;
  }
  _d = local_158.d;
  if (local_158.d < local_108.d) {
    _d = local_108.d;
  }
  _c = local_158.c;
  if (local_158.c < local_108.c) {
    _c = local_108.c;
  }
  pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  switch(iVar50) {
  case 1:
    Mat::create(pMVar5,iVar49,4,local_160->blob_allocator);
    if (iVar50 == 4) goto switchD_003c37fd_caseD_4;
    if (iVar50 == 3) goto switchD_003c37fd_caseD_3;
    if (iVar50 == 2) goto switchD_003c37fd_caseD_2;
    break;
  case 2:
switchD_003c37fd_caseD_2:
    Mat::create(pMVar5,iVar49,iVar1,4,local_160->blob_allocator);
    if (iVar50 == 4) goto switchD_003c37fd_caseD_4;
    if (iVar50 == 3) goto switchD_003c37fd_caseD_3;
    break;
  case 3:
switchD_003c37fd_caseD_3:
    Mat::create(pMVar5,iVar49,iVar1,_c,4,local_160->blob_allocator);
    if (iVar50 == 4) goto switchD_003c37fd_caseD_4;
    break;
  case 4:
switchD_003c37fd_caseD_4:
    Mat::create(pMVar5,iVar49,iVar1,_d,_c,4,local_160->blob_allocator);
  }
  pvVar7 = pMVar5->data;
  iVar50 = -100;
  if ((pvVar7 == (void *)0x0) || (local_78 = pvVar7, (long)pMVar5->c * pMVar5->cstep == 0))
  goto switchD_003c38ed_default;
  iVar49 = 0;
  iVar50 = 0;
  switch(local_a8->op_type) {
  case 0:
    iVar1 = pMVar5->dims;
    uVar2 = pMVar5->h;
    local_160 = (Option *)CONCAT44(local_160._4_4_,uVar2);
    uVar3 = pMVar5->w;
    local_a8 = (BinaryOp *)(long)(int)uVar3;
    local_b4 = pMVar5->d;
    uVar4 = pMVar5->c;
    local_70 = (ulong)uVar4;
    local_b0 = (float *)CONCAT44(local_b0._4_4_,iVar1);
    if (iVar1 == 2) {
      if (0 < (int)uVar2) {
        local_80 = (float *)local_108.data;
        local_90 = (float *)local_158.data;
        uVar54 = 1;
        if (1 < (int)uVar2) {
          uVar54 = (ulong)uVar2;
        }
        sVar8 = pMVar5->elemsize;
        local_88 = (float *)((long)local_108.w *
                            CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
        local_98 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
        uVar56 = 0;
        pvVar60 = pvVar7;
        do {
          uVar58 = (long)(local_108.h + -1);
          if ((long)uVar56 < (long)(local_108.h + -1)) {
            uVar58 = uVar56;
          }
          uVar59 = (long)(local_158.h + -1);
          if ((long)uVar56 < (long)(local_158.h + -1)) {
            uVar59 = uVar56;
          }
          if (0 < (int)uVar3) {
            pfVar46 = (float *)(uVar58 * (long)local_88 + (long)local_108.data);
            pfVar48 = (float *)(uVar59 * local_98 + (long)local_158.data);
            uVar58 = 0;
            do {
              *(float *)((long)pvVar60 + uVar58 * 4) = *pfVar48 + *pfVar46;
              uVar58 = uVar58 + 1;
              pfVar46 = pfVar46 + (1 < (long)local_108.w);
              pfVar48 = pfVar48 + (1 < (long)local_158.w);
            } while (uVar3 != uVar58);
          }
          uVar56 = uVar56 + 1;
          pvVar60 = (void *)((long)pvVar60 + sVar8 * (long)local_a8);
        } while (uVar56 != uVar54);
      }
    }
    else if ((iVar1 == 1) && (0 < (int)uVar3)) {
      uVar54 = 0;
      pfVar46 = (float *)local_158.data;
      pfVar48 = (float *)local_108.data;
      do {
        *(float *)((long)pvVar7 + uVar54 * 4) = *pfVar46 + *pfVar48;
        uVar54 = uVar54 + 1;
        pfVar48 = pfVar48 + (1 < local_108.w);
        pfVar46 = pfVar46 + (1 < local_158.w);
      } while (uVar3 != uVar54);
    }
    iVar50 = iVar49;
    if (0 < (int)uVar4 && iVar1 - 3U < 2) {
      local_68 = pMVar5->elemsize * pMVar5->cstep;
      local_a0 = 0;
      do {
        if (0 < local_b4) {
          pvVar60 = (void *)(local_68 * local_a0 + (long)pvVar7);
          local_80 = (float *)(long)local_108.w;
          local_58 = (long)local_108.h;
          local_88 = (float *)local_108.data;
          local_90 = (float *)CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          local_98 = (long)local_158.w;
          local_60 = (long)local_158.h;
          local_b0 = (float *)local_158.data;
          local_38 = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          uVar54 = (long)(local_158.c + -1);
          if ((long)local_a0 < (long)(local_158.c + -1)) {
            uVar54 = local_a0;
          }
          local_48 = (long)(local_158.d + -1);
          uVar56 = (long)(local_108.c + -1);
          if ((long)local_a0 < (long)(local_108.c + -1)) {
            uVar56 = local_a0;
          }
          local_50 = (long)(local_108.d + -1);
          lVar51 = 0;
          do {
            local_40 = lVar51;
            lVar51 = local_48;
            if (local_40 < local_48) {
              lVar51 = local_40;
            }
            lVar55 = local_50;
            if (local_40 < local_50) {
              lVar55 = local_40;
            }
            if (0 < (int)uVar2) {
              lVar57 = 0;
              do {
                lVar47 = (long)(local_158.h + -1);
                if (lVar57 < local_158.h + -1) {
                  lVar47 = lVar57;
                }
                lVar45 = (long)(local_108.h + -1);
                if (lVar57 < local_108.h + -1) {
                  lVar45 = lVar57;
                }
                if (0 < (int)uVar3) {
                  pfVar48 = (float *)(((lVar47 + lVar51 * local_60) * local_98 +
                                      uVar54 * local_158.cstep) * local_38 + (long)local_158.data);
                  pfVar46 = (float *)(((lVar45 + lVar55 * local_58) * (long)local_80 +
                                      uVar56 * local_108.cstep) * (long)local_90 +
                                     (long)local_108.data);
                  uVar58 = 0;
                  do {
                    *(float *)((long)pvVar60 + uVar58 * 4) = *pfVar48 + *pfVar46;
                    uVar58 = uVar58 + 1;
                    pfVar48 = pfVar48 + (1 < local_158.w);
                    pfVar46 = pfVar46 + (1 < local_108.w);
                  } while (uVar3 != uVar58);
                }
                pvVar60 = (void *)((long)pvVar60 + (long)local_a8 * 4);
                lVar57 = lVar57 + 1;
              } while ((uint)lVar57 != uVar2);
            }
            lVar51 = local_40 + 1;
          } while ((int)(local_40 + 1) != local_b4);
        }
        local_a0 = local_a0 + 1;
        iVar50 = 0;
      } while (local_a0 != local_70);
    }
    break;
  case 1:
    pMVar53 = &local_108;
    pMVar52 = &local_158;
    goto LAB_003c3b87;
  case 2:
    iVar1 = pMVar5->dims;
    uVar2 = pMVar5->h;
    local_160 = (Option *)CONCAT44(local_160._4_4_,uVar2);
    uVar3 = pMVar5->w;
    local_a8 = (BinaryOp *)(long)(int)uVar3;
    local_b4 = pMVar5->d;
    uVar4 = pMVar5->c;
    local_70 = (ulong)uVar4;
    local_b0 = (float *)CONCAT44(local_b0._4_4_,iVar1);
    if (iVar1 == 2) {
      if (0 < (int)uVar2) {
        local_80 = (float *)local_108.data;
        local_90 = (float *)local_158.data;
        uVar54 = 1;
        if (1 < (int)uVar2) {
          uVar54 = (ulong)uVar2;
        }
        sVar8 = pMVar5->elemsize;
        local_88 = (float *)((long)local_108.w *
                            CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
        local_98 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
        uVar56 = 0;
        pvVar60 = pvVar7;
        do {
          uVar58 = (long)(local_108.h + -1);
          if ((long)uVar56 < (long)(local_108.h + -1)) {
            uVar58 = uVar56;
          }
          uVar59 = (long)(local_158.h + -1);
          if ((long)uVar56 < (long)(local_158.h + -1)) {
            uVar59 = uVar56;
          }
          if (0 < (int)uVar3) {
            pfVar46 = (float *)(uVar58 * (long)local_88 + (long)local_108.data);
            pfVar48 = (float *)(uVar59 * local_98 + (long)local_158.data);
            uVar58 = 0;
            do {
              *(float *)((long)pvVar60 + uVar58 * 4) = *pfVar48 * *pfVar46;
              uVar58 = uVar58 + 1;
              pfVar46 = pfVar46 + (1 < (long)local_108.w);
              pfVar48 = pfVar48 + (1 < (long)local_158.w);
            } while (uVar3 != uVar58);
          }
          uVar56 = uVar56 + 1;
          pvVar60 = (void *)((long)pvVar60 + sVar8 * (long)local_a8);
        } while (uVar56 != uVar54);
      }
    }
    else if ((iVar1 == 1) && (0 < (int)uVar3)) {
      uVar54 = 0;
      pfVar46 = (float *)local_158.data;
      pfVar48 = (float *)local_108.data;
      do {
        *(float *)((long)pvVar7 + uVar54 * 4) = *pfVar46 * *pfVar48;
        uVar54 = uVar54 + 1;
        pfVar48 = pfVar48 + (1 < local_108.w);
        pfVar46 = pfVar46 + (1 < local_158.w);
      } while (uVar3 != uVar54);
    }
    iVar50 = iVar49;
    if (0 < (int)uVar4 && iVar1 - 3U < 2) {
      local_68 = pMVar5->elemsize * pMVar5->cstep;
      local_a0 = 0;
      do {
        if (0 < local_b4) {
          pvVar60 = (void *)(local_68 * local_a0 + (long)pvVar7);
          local_80 = (float *)(long)local_108.w;
          local_58 = (long)local_108.h;
          local_88 = (float *)local_108.data;
          local_90 = (float *)CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          local_98 = (long)local_158.w;
          local_60 = (long)local_158.h;
          local_b0 = (float *)local_158.data;
          local_38 = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          uVar54 = (long)(local_158.c + -1);
          if ((long)local_a0 < (long)(local_158.c + -1)) {
            uVar54 = local_a0;
          }
          local_48 = (long)(local_158.d + -1);
          uVar56 = (long)(local_108.c + -1);
          if ((long)local_a0 < (long)(local_108.c + -1)) {
            uVar56 = local_a0;
          }
          local_50 = (long)(local_108.d + -1);
          lVar51 = 0;
          do {
            local_40 = lVar51;
            lVar51 = local_48;
            if (local_40 < local_48) {
              lVar51 = local_40;
            }
            lVar55 = local_50;
            if (local_40 < local_50) {
              lVar55 = local_40;
            }
            if (0 < (int)uVar2) {
              lVar57 = 0;
              do {
                lVar47 = (long)(local_158.h + -1);
                if (lVar57 < local_158.h + -1) {
                  lVar47 = lVar57;
                }
                lVar45 = (long)(local_108.h + -1);
                if (lVar57 < local_108.h + -1) {
                  lVar45 = lVar57;
                }
                if (0 < (int)uVar3) {
                  pfVar48 = (float *)(((lVar47 + lVar51 * local_60) * local_98 +
                                      uVar54 * local_158.cstep) * local_38 + (long)local_158.data);
                  pfVar46 = (float *)(((lVar45 + lVar55 * local_58) * (long)local_80 +
                                      uVar56 * local_108.cstep) * (long)local_90 +
                                     (long)local_108.data);
                  uVar58 = 0;
                  do {
                    *(float *)((long)pvVar60 + uVar58 * 4) = *pfVar48 * *pfVar46;
                    uVar58 = uVar58 + 1;
                    pfVar48 = pfVar48 + (1 < local_158.w);
                    pfVar46 = pfVar46 + (1 < local_108.w);
                  } while (uVar3 != uVar58);
                }
                pvVar60 = (void *)((long)pvVar60 + (long)local_a8 * 4);
                lVar57 = lVar57 + 1;
              } while ((uint)lVar57 != uVar2);
            }
            lVar51 = local_40 + 1;
          } while ((int)(local_40 + 1) != local_b4);
        }
        local_a0 = local_a0 + 1;
        iVar50 = 0;
      } while (local_a0 != local_70);
    }
    break;
  case 3:
    pMVar52 = &local_108;
    pMVar53 = &local_158;
    goto LAB_003c3c97;
  case 4:
    iVar1 = pMVar5->dims;
    uVar2 = pMVar5->h;
    local_160 = (Option *)CONCAT44(local_160._4_4_,uVar2);
    uVar3 = pMVar5->w;
    local_a8 = (BinaryOp *)(long)(int)uVar3;
    local_b4 = pMVar5->d;
    uVar4 = pMVar5->c;
    local_70 = (ulong)uVar4;
    local_b0 = (float *)CONCAT44(local_b0._4_4_,iVar1);
    if (iVar1 == 2) {
      if (0 < (int)uVar2) {
        local_80 = (float *)local_108.data;
        local_90 = (float *)local_158.data;
        uVar54 = 1;
        if (1 < (int)uVar2) {
          uVar54 = (ulong)uVar2;
        }
        sVar8 = pMVar5->elemsize;
        local_88 = (float *)((long)local_108.w *
                            CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
        local_98 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
        uVar56 = 0;
        pvVar60 = pvVar7;
        do {
          uVar58 = (long)(local_108.h + -1);
          if ((long)uVar56 < (long)(local_108.h + -1)) {
            uVar58 = uVar56;
          }
          uVar59 = (long)(local_158.h + -1);
          if ((long)uVar56 < (long)(local_158.h + -1)) {
            uVar59 = uVar56;
          }
          if (0 < (int)uVar3) {
            pfVar46 = (float *)(uVar58 * (long)local_88 + (long)local_108.data);
            pfVar48 = (float *)(uVar59 * local_98 + (long)local_158.data);
            uVar58 = 0;
            do {
              fVar61 = *pfVar48;
              if (*pfVar48 <= *pfVar46) {
                fVar61 = *pfVar46;
              }
              *(float *)((long)pvVar60 + uVar58 * 4) = fVar61;
              uVar58 = uVar58 + 1;
              pfVar46 = pfVar46 + (1 < (long)local_108.w);
              pfVar48 = pfVar48 + (1 < (long)local_158.w);
            } while (uVar3 != uVar58);
          }
          uVar56 = uVar56 + 1;
          pvVar60 = (void *)((long)pvVar60 + sVar8 * (long)local_a8);
        } while (uVar56 != uVar54);
      }
    }
    else if ((iVar1 == 1) && (0 < (int)uVar3)) {
      uVar54 = 0;
      pfVar46 = (float *)local_158.data;
      pfVar48 = (float *)local_108.data;
      do {
        fVar61 = *pfVar46;
        if (*pfVar46 <= *pfVar48) {
          fVar61 = *pfVar48;
        }
        *(float *)((long)pvVar7 + uVar54 * 4) = fVar61;
        uVar54 = uVar54 + 1;
        pfVar48 = pfVar48 + (1 < local_108.w);
        pfVar46 = pfVar46 + (1 < local_158.w);
      } while (uVar3 != uVar54);
    }
    iVar50 = iVar49;
    if (0 < (int)uVar4 && iVar1 - 3U < 2) {
      local_68 = pMVar5->elemsize * pMVar5->cstep;
      local_a0 = 0;
      do {
        if (0 < local_b4) {
          pvVar60 = (void *)(local_68 * local_a0 + (long)pvVar7);
          local_80 = (float *)(long)local_108.w;
          local_58 = (long)local_108.h;
          local_88 = (float *)local_108.data;
          local_90 = (float *)CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          local_98 = (long)local_158.w;
          local_60 = (long)local_158.h;
          local_b0 = (float *)local_158.data;
          local_38 = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          uVar54 = (long)(local_158.c + -1);
          if ((long)local_a0 < (long)(local_158.c + -1)) {
            uVar54 = local_a0;
          }
          local_48 = (long)(local_158.d + -1);
          uVar56 = (long)(local_108.c + -1);
          if ((long)local_a0 < (long)(local_108.c + -1)) {
            uVar56 = local_a0;
          }
          local_50 = (long)(local_108.d + -1);
          lVar51 = 0;
          do {
            local_40 = lVar51;
            lVar51 = local_48;
            if (local_40 < local_48) {
              lVar51 = local_40;
            }
            lVar55 = local_50;
            if (local_40 < local_50) {
              lVar55 = local_40;
            }
            if (0 < (int)uVar2) {
              lVar57 = 0;
              do {
                lVar47 = (long)(local_158.h + -1);
                if (lVar57 < local_158.h + -1) {
                  lVar47 = lVar57;
                }
                lVar45 = (long)(local_108.h + -1);
                if (lVar57 < local_108.h + -1) {
                  lVar45 = lVar57;
                }
                if (0 < (int)uVar3) {
                  pfVar48 = (float *)(((lVar47 + lVar51 * local_60) * local_98 +
                                      uVar54 * local_158.cstep) * local_38 + (long)local_158.data);
                  pfVar46 = (float *)(((lVar45 + lVar55 * local_58) * (long)local_80 +
                                      uVar56 * local_108.cstep) * (long)local_90 +
                                     (long)local_108.data);
                  uVar58 = 0;
                  do {
                    fVar61 = *pfVar48;
                    if (*pfVar48 <= *pfVar46) {
                      fVar61 = *pfVar46;
                    }
                    *(float *)((long)pvVar60 + uVar58 * 4) = fVar61;
                    uVar58 = uVar58 + 1;
                    pfVar48 = pfVar48 + (1 < local_158.w);
                    pfVar46 = pfVar46 + (1 < local_108.w);
                  } while (uVar3 != uVar58);
                }
                pvVar60 = (void *)((long)pvVar60 + (long)local_a8 * 4);
                lVar57 = lVar57 + 1;
              } while ((uint)lVar57 != uVar2);
            }
            lVar51 = local_40 + 1;
          } while ((int)(local_40 + 1) != local_b4);
        }
        local_a0 = local_a0 + 1;
        iVar50 = 0;
      } while (local_a0 != local_70);
    }
    break;
  case 5:
    iVar1 = pMVar5->dims;
    uVar2 = pMVar5->h;
    local_160 = (Option *)CONCAT44(local_160._4_4_,uVar2);
    uVar3 = pMVar5->w;
    local_a8 = (BinaryOp *)(long)(int)uVar3;
    local_b4 = pMVar5->d;
    uVar4 = pMVar5->c;
    local_70 = (ulong)uVar4;
    local_b0 = (float *)CONCAT44(local_b0._4_4_,iVar1);
    if (iVar1 == 2) {
      if (0 < (int)uVar2) {
        local_80 = (float *)local_108.data;
        local_90 = (float *)local_158.data;
        uVar54 = 1;
        if (1 < (int)uVar2) {
          uVar54 = (ulong)uVar2;
        }
        sVar8 = pMVar5->elemsize;
        local_88 = (float *)((long)local_108.w *
                            CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
        local_98 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
        uVar56 = 0;
        pvVar60 = pvVar7;
        do {
          uVar58 = (long)(local_108.h + -1);
          if ((long)uVar56 < (long)(local_108.h + -1)) {
            uVar58 = uVar56;
          }
          uVar59 = (long)(local_158.h + -1);
          if ((long)uVar56 < (long)(local_158.h + -1)) {
            uVar59 = uVar56;
          }
          if (0 < (int)uVar3) {
            pfVar46 = (float *)(uVar58 * (long)local_88 + (long)local_108.data);
            pfVar48 = (float *)(uVar59 * local_98 + (long)local_158.data);
            uVar58 = 0;
            do {
              fVar61 = *pfVar48;
              if (*pfVar46 <= *pfVar48) {
                fVar61 = *pfVar46;
              }
              *(float *)((long)pvVar60 + uVar58 * 4) = fVar61;
              uVar58 = uVar58 + 1;
              pfVar46 = pfVar46 + (1 < (long)local_108.w);
              pfVar48 = pfVar48 + (1 < (long)local_158.w);
            } while (uVar3 != uVar58);
          }
          uVar56 = uVar56 + 1;
          pvVar60 = (void *)((long)pvVar60 + sVar8 * (long)local_a8);
        } while (uVar56 != uVar54);
      }
    }
    else if ((iVar1 == 1) && (0 < (int)uVar3)) {
      uVar54 = 0;
      pfVar46 = (float *)local_158.data;
      pfVar48 = (float *)local_108.data;
      do {
        fVar61 = *pfVar46;
        if (*pfVar48 <= *pfVar46) {
          fVar61 = *pfVar48;
        }
        *(float *)((long)pvVar7 + uVar54 * 4) = fVar61;
        uVar54 = uVar54 + 1;
        pfVar48 = pfVar48 + (1 < local_108.w);
        pfVar46 = pfVar46 + (1 < local_158.w);
      } while (uVar3 != uVar54);
    }
    iVar50 = iVar49;
    if (0 < (int)uVar4 && iVar1 - 3U < 2) {
      local_68 = pMVar5->elemsize * pMVar5->cstep;
      local_a0 = 0;
      do {
        if (0 < local_b4) {
          pvVar60 = (void *)(local_68 * local_a0 + (long)pvVar7);
          local_80 = (float *)(long)local_108.w;
          local_58 = (long)local_108.h;
          local_88 = (float *)local_108.data;
          local_90 = (float *)CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          local_98 = (long)local_158.w;
          local_60 = (long)local_158.h;
          local_b0 = (float *)local_158.data;
          local_38 = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          uVar54 = (long)(local_158.c + -1);
          if ((long)local_a0 < (long)(local_158.c + -1)) {
            uVar54 = local_a0;
          }
          local_48 = (long)(local_158.d + -1);
          uVar56 = (long)(local_108.c + -1);
          if ((long)local_a0 < (long)(local_108.c + -1)) {
            uVar56 = local_a0;
          }
          local_50 = (long)(local_108.d + -1);
          lVar51 = 0;
          do {
            local_40 = lVar51;
            lVar51 = local_48;
            if (local_40 < local_48) {
              lVar51 = local_40;
            }
            lVar55 = local_50;
            if (local_40 < local_50) {
              lVar55 = local_40;
            }
            if (0 < (int)uVar2) {
              lVar57 = 0;
              do {
                lVar47 = (long)(local_158.h + -1);
                if (lVar57 < local_158.h + -1) {
                  lVar47 = lVar57;
                }
                lVar45 = (long)(local_108.h + -1);
                if (lVar57 < local_108.h + -1) {
                  lVar45 = lVar57;
                }
                if (0 < (int)uVar3) {
                  pfVar48 = (float *)(((lVar47 + lVar51 * local_60) * local_98 +
                                      uVar54 * local_158.cstep) * local_38 + (long)local_158.data);
                  pfVar46 = (float *)(((lVar45 + lVar55 * local_58) * (long)local_80 +
                                      uVar56 * local_108.cstep) * (long)local_90 +
                                     (long)local_108.data);
                  uVar58 = 0;
                  do {
                    fVar61 = *pfVar48;
                    if (*pfVar46 <= *pfVar48) {
                      fVar61 = *pfVar46;
                    }
                    *(float *)((long)pvVar60 + uVar58 * 4) = fVar61;
                    uVar58 = uVar58 + 1;
                    pfVar48 = pfVar48 + (1 < local_158.w);
                    pfVar46 = pfVar46 + (1 < local_108.w);
                  } while (uVar3 != uVar58);
                }
                pvVar60 = (void *)((long)pvVar60 + (long)local_a8 * 4);
                lVar57 = lVar57 + 1;
              } while ((uint)lVar57 != uVar2);
            }
            lVar51 = local_40 + 1;
          } while ((int)(local_40 + 1) != local_b4);
        }
        local_a0 = local_a0 + 1;
        iVar50 = 0;
      } while (local_a0 != local_70);
    }
    break;
  case 6:
    pMVar53 = &local_108;
    pMVar52 = &local_158;
    goto LAB_003c3c63;
  case 7:
    pMVar53 = &local_158;
    pMVar52 = &local_108;
LAB_003c3b87:
    binary_op_broadcast<ncnn::binary_op_sub>
              (pMVar53,pMVar52,pMVar5,(Option *)&switchD_003c38ed::switchdataD_005fb1e0);
    iVar50 = iVar49;
    break;
  case 8:
    pMVar52 = &local_158;
    pMVar53 = &local_108;
LAB_003c3c97:
    binary_op_broadcast<ncnn::binary_op_div>
              (pMVar52,pMVar53,pMVar5,(Option *)&switchD_003c38ed::switchdataD_005fb1e0);
    iVar50 = iVar49;
    break;
  case 9:
    pMVar53 = &local_158;
    pMVar52 = &local_108;
LAB_003c3c63:
    binary_op_broadcast<ncnn::binary_op_pow>
              (pMVar53,pMVar52,pMVar5,(Option *)&switchD_003c38ed::switchdataD_005fb1e0);
    iVar50 = iVar49;
    break;
  case 10:
    pMVar53 = &local_108;
    pMVar52 = &local_158;
    goto LAB_003c3c7d;
  case 0xb:
    pMVar53 = &local_158;
    pMVar52 = &local_108;
LAB_003c3c7d:
    binary_op_broadcast<ncnn::binary_op_atan2>
              (pMVar53,pMVar52,pMVar5,(Option *)&switchD_003c38ed::switchdataD_005fb1e0);
  }
switchD_003c38ed_default:
  piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if ((float *)local_158.data != (float *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize._0_4_ = 0;
  local_158.elemsize._4_4_ = 0;
  local_158.elempack = 0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if ((float *)local_108.data != (float *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar50;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    const int outdims = std::max(A.dims, B.dims);

    Mat A2 = A;
    Mat B2 = B;
    if (A.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (A.w == B.h)
                A2 = A.reshape(1, A.w);
            else // if (A.w == B.w)
                A2 = A.reshape(A.w, 1);
        }
        if (outdims == 3 && A.dims == 1)
        {
            if (A.w == B.c)
                A2 = A.reshape(1, 1, A.w);
            else // if (A.w == B.w)
                A2 = A.reshape(A.w, 1, 1);
        }
        if (outdims == 3 && A.dims == 2)
            A2 = A.reshape(1, A.w, A.h);
        if (outdims == 4 && A.dims == 1)
        {
            if (A.w == B.c)
                A2 = A.reshape(1, 1, 1, A.w);
            else // if (A.w == B.w)
                A2 = A.reshape(A.w, 1, 1, 1);
        }
        if (outdims == 4 && A.dims == 2)
            A2 = A.reshape(1, 1, A.w, A.h);
        if (outdims == 4 && A.dims == 3)
            A2 = A.reshape(1, A.w, A.h, A.c);
    }
    if (B.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (B.w == A.h)
                B2 = B.reshape(1, B.w);
            else // if (B.w == A.w)
                B2 = B.reshape(B.w, 1);
        }
        if (outdims == 3 && B.dims == 1)
        {
            if (B.w == A.c)
                B2 = B.reshape(1, 1, B.w);
            else // if (B.w == A.w)
                B2 = B.reshape(B.w, 1, 1);
        }
        if (outdims == 3 && B.dims == 2)
            B2 = B.reshape(1, B.w, B.h);
        if (outdims == 4 && B.dims == 1)
        {
            if (B.w == A.c)
                B2 = B.reshape(1, 1, 1, B.w);
            else // if (B.w == A.w)
                B2 = B.reshape(B.w, 1, 1, 1);
        }
        if (outdims == 4 && B.dims == 2)
            B2 = B.reshape(1, 1, B.w, B.h);
        if (outdims == 4 && B.dims == 3)
            B2 = B.reshape(1, B.w, B.h, B.c);
    }

    const int outw = std::max(A2.w, B2.w);
    const int outh = std::max(A2.h, B2.h);
    const int outd = std::max(A2.d, B2.d);
    const int outc = std::max(A2.c, B2.c);

    Mat& top_blob = top_blobs[0];
    if (outdims == 1)
    {
        top_blob.create(outw, 4u, opt.blob_allocator);
    }
    if (outdims == 2)
    {
        top_blob.create(outw, outh, 4u, opt.blob_allocator);
    }
    if (outdims == 3)
    {
        top_blob.create(outw, outh, outc, 4u, opt.blob_allocator);
    }
    if (outdims == 4)
    {
        top_blob.create(outw, outh, outd, outc, 4u, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    binary_op_broadcast(A2, B2, top_blob, op_type, opt);

    return 0;
}